

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vcf.c
# Opt level: O1

int bcf_hdr_combine(bcf_hdr_t *dst,bcf_hdr_t *src)

{
  uint uVar1;
  bcf_hrec_t **ppbVar2;
  char **ppcVar3;
  uint *puVar4;
  uint *puVar5;
  char *__s2;
  long lVar6;
  char cVar7;
  int iVar8;
  uint uVar9;
  uint uVar10;
  int iVar11;
  uint uVar12;
  bcf_hrec_t *pbVar13;
  bcf_hrec_t *pbVar14;
  byte bVar15;
  char *pcVar16;
  uint uVar17;
  ulong uVar18;
  uint uVar19;
  uint uVar20;
  bool bVar21;
  bool bVar22;
  int local_a0;
  int local_9c;
  long local_68;
  
  if (src->nhrec < 1) {
    bVar22 = true;
    local_9c = 0;
  }
  else {
    uVar1 = dst->nhrec;
    local_68 = 0;
    local_a0 = 0;
    local_9c = 0;
    do {
      pbVar14 = src->hrec[local_68];
      iVar8 = pbVar14->type;
      if (iVar8 == 4) {
        uVar9 = bcf_hrec_find_key(pbVar14,"ID");
        if ((-1 < (int)uVar9) &&
           (pbVar13 = bcf_hdr_get_hrec(dst,4,"ID",pbVar14->vals[uVar9],pbVar14->key),
           pbVar13 == (bcf_hrec_t *)0x0)) {
          pbVar14 = bcf_hrec_dup(pbVar14);
          iVar8 = bcf_hdr_add_hrec(dst,pbVar14);
          local_a0 = local_a0 + iVar8;
        }
      }
      else if ((iVar8 == 5) && (pbVar14->value != (char *)0x0)) {
        if (0 < (int)uVar1) {
          ppbVar2 = dst->hrec;
          uVar18 = 1;
          bVar22 = 0 < (int)uVar1;
          do {
            if ((ppbVar2[uVar18 - 1]->type == 5) &&
               (iVar8 = strcmp(pbVar14->key,ppbVar2[uVar18 - 1]->key), iVar8 == 0)) {
              if (bVar22) goto LAB_0011d96f;
              break;
            }
            bVar22 = (long)uVar18 < (long)(int)uVar1;
            bVar21 = uVar18 != uVar1;
            uVar18 = uVar18 + 1;
          } while (bVar21);
        }
        pbVar14 = bcf_hrec_dup(pbVar14);
        iVar8 = bcf_hdr_add_hrec(dst,pbVar14);
        local_a0 = local_a0 + iVar8;
      }
      else {
        uVar9 = bcf_hrec_find_key(pbVar14,"ID");
        if ((int)uVar9 < 0) {
          __assert_fail("j>=0",
                        "/workspace/llm4binary/github/license_c_cmakelists/gatoravi[P]bam-parser-tutorial/htslib/vcf.c"
                        ,0x8c4,"int bcf_hdr_combine(bcf_hdr_t *, const bcf_hdr_t *)");
        }
        ppcVar3 = pbVar14->vals;
        pbVar13 = bcf_hdr_get_hrec(dst,iVar8,"ID",ppcVar3[uVar9],(char *)0x0);
        if (pbVar13 == (bcf_hrec_t *)0x0) {
          pbVar14 = bcf_hrec_dup(pbVar14);
          iVar8 = bcf_hdr_add_hrec(dst,pbVar14);
          local_a0 = local_a0 + iVar8;
        }
        else if (iVar8 - 1U < 2) {
          puVar4 = (uint *)src->dict[0];
          puVar5 = (uint *)dst->dict[0];
          __s2 = *ppcVar3;
          uVar9 = *puVar4;
          uVar18 = 0;
          if (uVar9 != 0) {
            uVar17 = (uint)*__s2;
            if (*__s2 == '\0') {
              uVar17 = 0;
            }
            else {
              cVar7 = __s2[1];
              if (cVar7 != '\0') {
                pcVar16 = __s2 + 2;
                do {
                  uVar17 = (int)cVar7 + uVar17 * 0x1f;
                  cVar7 = *pcVar16;
                  pcVar16 = pcVar16 + 1;
                } while (cVar7 != '\0');
              }
            }
            uVar17 = uVar17 & uVar9 - 1;
            lVar6 = *(long *)(puVar4 + 4);
            iVar8 = 1;
            uVar19 = uVar17;
            do {
              uVar20 = *(uint *)(lVar6 + (ulong)(uVar19 >> 4) * 4);
              bVar15 = (char)uVar19 * '\x02' & 0x1e;
              uVar10 = uVar20 >> bVar15;
              if (((uVar10 & 2) != 0) ||
                 (((uVar10 & 1) == 0 &&
                  (iVar11 = strcmp(*(char **)(*(long *)(puVar4 + 6) + (ulong)uVar19 * 8),__s2),
                  iVar11 == 0)))) {
                if ((uVar20 >> bVar15 & 3) == 0) {
                  uVar9 = uVar19;
                }
                break;
              }
              uVar19 = uVar19 + iVar8 & uVar9 - 1;
              iVar8 = iVar8 + 1;
            } while (uVar19 != uVar17);
            uVar18 = (ulong)uVar9;
          }
          uVar9 = *puVar5;
          uVar17 = 0;
          if (uVar9 != 0) {
            uVar19 = (uint)*__s2;
            if (*__s2 == '\0') {
              uVar19 = 0;
            }
            else {
              cVar7 = __s2[1];
              if (cVar7 != '\0') {
                pcVar16 = __s2 + 2;
                do {
                  uVar19 = (int)cVar7 + uVar19 * 0x1f;
                  cVar7 = *pcVar16;
                  pcVar16 = pcVar16 + 1;
                } while (cVar7 != '\0');
              }
            }
            uVar19 = uVar19 & uVar9 - 1;
            lVar6 = *(long *)(puVar5 + 4);
            iVar8 = 1;
            uVar20 = uVar19;
            do {
              uVar10 = *(uint *)(lVar6 + (ulong)(uVar20 >> 4) * 4);
              bVar15 = (char)uVar20 * '\x02' & 0x1e;
              uVar12 = uVar10 >> bVar15;
              uVar17 = uVar9;
              if (((uVar12 & 2) != 0) ||
                 (((uVar12 & 1) == 0 &&
                  (iVar11 = strcmp(*(char **)(*(long *)(puVar5 + 6) + (ulong)uVar20 * 8),__s2),
                  iVar11 == 0)))) {
                if ((uVar10 >> bVar15 & 3) == 0) {
                  uVar17 = uVar20;
                }
                break;
              }
              uVar20 = uVar20 + iVar8 & uVar9 - 1;
              iVar8 = iVar8 + 1;
            } while (uVar20 != uVar19);
          }
          if (((*(uint *)(*(long *)(puVar5 + 8) + (ulong)uVar17 * 0x30 + (long)pbVar13->type * 4) ^
               *(uint *)(*(long *)(puVar4 + 8) + uVar18 * 0x30 + (long)pbVar13->type * 4)) & 0xf00)
              != 0) {
            fprintf(_stderr,
                    "Warning: trying to combine \"%s\" tag definitions of different lengths\n",__s2)
            ;
            local_9c = 1;
          }
          if (((*(uint *)((ulong)uVar17 * 0x30 + *(long *)(puVar5 + 8) + (long)pbVar13->type * 4) ^
               *(uint *)(uVar18 * 0x30 + *(long *)(puVar4 + 8) + (long)pbVar13->type * 4)) & 0xf0)
              != 0) {
            bcf_hdr_combine_cold_1();
            local_9c = 1;
          }
        }
      }
LAB_0011d96f:
      local_68 = local_68 + 1;
    } while (local_68 < src->nhrec);
    bVar22 = local_a0 == 0;
  }
  if (!bVar22) {
    bcf_hdr_sync(dst);
  }
  return local_9c;
}

Assistant:

int bcf_hdr_combine(bcf_hdr_t *dst, const bcf_hdr_t *src)
{
    int i, ndst_ori = dst->nhrec, need_sync = 0, ret = 0;
    for (i=0; i<src->nhrec; i++)
    {
        if ( src->hrec[i]->type==BCF_HL_GEN && src->hrec[i]->value )
        {
            int j;
            for (j=0; j<ndst_ori; j++)
            {
                if ( dst->hrec[j]->type!=BCF_HL_GEN ) continue;

                // Checking only the key part of generic lines, otherwise
                // the VCFs are too verbose. Should we perhaps add a flag
                // to bcf_hdr_combine() and make this optional?
                if ( !strcmp(src->hrec[i]->key,dst->hrec[j]->key) ) break;
            }
            if ( j>=ndst_ori )
                need_sync += bcf_hdr_add_hrec(dst, bcf_hrec_dup(src->hrec[i]));
        }
        else if ( src->hrec[i]->type==BCF_HL_STR )
        {
            // NB: we are ignoring fields without ID
            int j = bcf_hrec_find_key(src->hrec[i],"ID");
            if ( j>=0 )
            {
                bcf_hrec_t *rec = bcf_hdr_get_hrec(dst, src->hrec[i]->type, "ID", src->hrec[i]->vals[j], src->hrec[i]->key);
                if ( !rec )
                    need_sync += bcf_hdr_add_hrec(dst, bcf_hrec_dup(src->hrec[i]));
            }
        }
        else
        {
            int j = bcf_hrec_find_key(src->hrec[i],"ID");
            assert( j>=0 ); // this should always be true for valid VCFs

            bcf_hrec_t *rec = bcf_hdr_get_hrec(dst, src->hrec[i]->type, "ID", src->hrec[i]->vals[j], NULL);
            if ( !rec )
                need_sync += bcf_hdr_add_hrec(dst, bcf_hrec_dup(src->hrec[i]));
            else if ( src->hrec[i]->type==BCF_HL_INFO || src->hrec[i]->type==BCF_HL_FMT )
            {
                // Check that both records are of the same type. The bcf_hdr_id2length
                // macro cannot be used here because dst header is not synced yet.
                vdict_t *d_src = (vdict_t*)src->dict[BCF_DT_ID];
                vdict_t *d_dst = (vdict_t*)dst->dict[BCF_DT_ID];
                khint_t k_src  = kh_get(vdict, d_src, src->hrec[i]->vals[0]);
                khint_t k_dst  = kh_get(vdict, d_dst, src->hrec[i]->vals[0]);
                if ( (kh_val(d_src,k_src).info[rec->type]>>8 & 0xf) != (kh_val(d_dst,k_dst).info[rec->type]>>8 & 0xf) )
                {
                    fprintf(stderr,"Warning: trying to combine \"%s\" tag definitions of different lengths\n", src->hrec[i]->vals[0]);
                    ret |= 1;
                }
                if ( (kh_val(d_src,k_src).info[rec->type]>>4 & 0xf) != (kh_val(d_dst,k_dst).info[rec->type]>>4 & 0xf) )
                {
                    fprintf(stderr,"Warning: trying to combine \"%s\" tag definitions of different types\n", src->hrec[i]->vals[0]);
                    ret |= 1;
                }
            }
        }
    }
    if ( need_sync ) bcf_hdr_sync(dst);
    return ret;
}